

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addUnknownChunks(ucvector *out,uchar *data,size_t datasize)

{
  uint uVar1;
  uchar *puStack_30;
  uint error;
  uchar *inchunk;
  size_t datasize_local;
  uchar *data_local;
  ucvector *out_local;
  
  puStack_30 = data;
  while( true ) {
    if (datasize <= (ulong)((long)puStack_30 - (long)data)) {
      return 0;
    }
    uVar1 = lodepng_chunk_append(&out->data,&out->size,puStack_30);
    if (uVar1 != 0) break;
    out->allocsize = out->size;
    puStack_30 = lodepng_chunk_next(puStack_30);
  }
  return uVar1;
}

Assistant:

static unsigned addUnknownChunks(ucvector* out, unsigned char* data, size_t datasize)
{
  unsigned char* inchunk = data;
  while((size_t)(inchunk - data) < datasize)
  {
    CERROR_TRY_RETURN(lodepng_chunk_append(&out->data, &out->size, inchunk));
    out->allocsize = out->size; /*fix the allocsize again*/
    inchunk = lodepng_chunk_next(inchunk);
  }
  return 0;
}